

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::DECIMAL
                  (Value *__return_storage_ptr__,int64_t value,uint8_t width,uint8_t scale)

{
  short sVar1;
  int iVar2;
  LogicalType decimal_type;
  LogicalType LStack_58;
  LogicalType local_40;
  hugeint_t local_28;
  
  LogicalType::DECIMAL(&local_40,width,scale);
  LogicalType::LogicalType(&LStack_58,&local_40);
  Value(__return_storage_ptr__,&LStack_58);
  LogicalType::~LogicalType(&LStack_58);
  if (local_40.physical_type_ == INT16) {
    sVar1 = NumericCastImpl<short,_long,_false>::Convert(value);
    (__return_storage_ptr__->value_).smallint = sVar1;
  }
  else if (local_40.physical_type_ == INT32) {
    iVar2 = NumericCastImpl<int,_long,_false>::Convert(value);
    (__return_storage_ptr__->value_).integer = iVar2;
  }
  else if (local_40.physical_type_ == INT64) {
    (__return_storage_ptr__->value_).bigint = value;
  }
  else {
    hugeint_t::hugeint_t(&local_28,value);
    (__return_storage_ptr__->value_).bigint = local_28.lower;
    (__return_storage_ptr__->value_).hugeint.upper = local_28.upper;
  }
  LogicalType::Verify(&__return_storage_ptr__->type_);
  __return_storage_ptr__->is_null = false;
  LogicalType::~LogicalType(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Value Value::DECIMAL(int64_t value, uint8_t width, uint8_t scale) {
	auto decimal_type = LogicalType::DECIMAL(width, scale);
	Value result(decimal_type);
	switch (decimal_type.InternalType()) {
	case PhysicalType::INT16:
		result.value_.smallint = NumericCast<int16_t>(value);
		break;
	case PhysicalType::INT32:
		result.value_.integer = NumericCast<int32_t>(value);
		break;
	case PhysicalType::INT64:
		result.value_.bigint = value;
		break;
	default:
		result.value_.hugeint = value;
		break;
	}
	result.type_.Verify();
	result.is_null = false;
	return result;
}